

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O2

int __thiscall ieee754::is_mantissa_zero(ieee754 *this)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = mantissa_msb_index(this);
  bVar1 = this->buf[(int)uVar3];
  bVar2 = mantissa_msb_mask(this);
  uVar4 = (uint)(bVar2 & bVar1);
  uVar5 = 0;
  uVar6 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    uVar4 = uVar4 + this->buf[uVar5];
  }
  return (int)(uVar4 == 0);
}

Assistant:

int is_mantissa_zero() const
    {
        /* add up the full bytes of the mantissa, plus the partial high byte */
        int imsb = mantissa_msb_index();
        int sum = buf[imsb] & mantissa_msb_mask();
        for (int i = 0 ; i < imsb ; sum += buf[i++]) ;

        /* the mantissa is zero if the sum of the bytes is zero */
        return (sum == 0);
    }